

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O0

optional<int> GetScriptNumber(opcodetype opcode,valtype *data,int min,int max)

{
  long lVar1;
  bool bVar2;
  int in_ECX;
  int in_EDX;
  undefined8 in_RSI;
  undefined4 in_EDI;
  long in_FS_OFFSET;
  scriptnum_error *anon_var_0;
  int count;
  opcodetype in_stack_ffffffffffffff88;
  opcodetype in_stack_ffffffffffffff8c;
  int *in_stack_ffffffffffffff90;
  optional<int> *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  undefined1 fRequireMinimal;
  undefined4 in_stack_ffffffffffffffd8;
  CScriptNum *in_stack_ffffffffffffffe0;
  undefined4 local_14;
  undefined8 local_10;
  
  fRequireMinimal = (undefined1)((ulong)in_RSI >> 0x38);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = IsSmallInteger(in_stack_ffffffffffffff8c);
  if (bVar2) {
    local_14 = CScript::DecodeOP_N(in_stack_ffffffffffffff88);
  }
  else {
    bVar2 = IsPushdataOp(in_stack_ffffffffffffff8c);
    if (!bVar2) {
      std::optional<int>::optional
                ((optional<int> *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
      goto LAB_00f75603;
    }
    bVar2 = CheckMinimalPush((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                             CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                             (opcodetype)((ulong)in_stack_ffffffffffffff98 >> 0x20));
    if (!bVar2) {
      std::optional<int>::optional
                ((optional<int> *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
      goto LAB_00f75603;
    }
    CScriptNum::CScriptNum
              (in_stack_ffffffffffffffe0,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT44(in_EDI,in_stack_ffffffffffffffd8),(bool)fRequireMinimal,
               CONCAT44(in_EDX,in_ECX));
    local_14 = CScriptNum::getint((CScriptNum *)
                                  CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  }
  if ((local_14 < in_EDX) || (in_ECX < local_14)) {
    std::optional<int>::optional
              ((optional<int> *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  }
  else {
    std::optional<int>::optional<int,_true>(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  }
LAB_00f75603:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (_Optional_base<int,_true,_true>)(_Optional_base<int,_true,_true>)local_10;
  }
  __stack_chk_fail();
}

Assistant:

static std::optional<int> GetScriptNumber(opcodetype opcode, valtype data, int min, int max)
{
    int count;
    if (IsSmallInteger(opcode)) {
        count = CScript::DecodeOP_N(opcode);
    } else if (IsPushdataOp(opcode)) {
        if (!CheckMinimalPush(data, opcode)) return {};
        try {
            count = CScriptNum(data, /* fRequireMinimal = */ true).getint();
        } catch (const scriptnum_error&) {
            return {};
        }
    } else {
        return {};
    }
    if (count < min || count > max) return {};
    return count;
}